

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O3

char JSONWorker::Hex(char **pos)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  byte bVar4;
  byte bVar5;
  
  pcVar3 = *pos;
  *pos = pcVar3 + 1;
  cVar2 = pcVar3[1];
  bVar1 = cVar2 - 0x30;
  bVar5 = cVar2 - 0x37;
  if (bVar1 < 10) {
    bVar5 = bVar1;
  }
  bVar4 = cVar2 + 0xa9;
  if (bVar1 < 0x31) {
    bVar4 = bVar5;
  }
  bVar5 = *pcVar3 * '\x10';
  bVar1 = bVar5 + 0x90;
  if (0xf5 < (byte)(*pcVar3 - 0x3aU)) {
    bVar1 = bVar5;
  }
  return bVar1 | bVar4;
}

Assistant:

json_char JSONWorker::Hex(const json_char * & pos) json_nothrow {
    /*
	takes the numeric value of the next two characters and convert them
	\u0058 becomes 0x58

	In case of \u, it's SpecialChar's responsibility to move past the first two chars
	as this method is also used for \x
	*/
    //First character
    json_uchar hi = *pos++ - 48;
    if (hi > 48){  //A-F don't immediately follow 0-9, so have to pull them down a little
	   hi -= 39;
    } else if (hi > 9){  //neither do a-f
	   hi -= 7;
    }
    //second character
    json_uchar lo = *pos - 48;
    if (lo > 48){  //A-F don't immediately follow 0-9, so have to pull them down a little
	   lo -= 39;
    } else if (lo > 9){  //neither do a-f
	   lo -= 7;
    }
    //combine them
    return (json_char)((hi << 4) | lo);
}